

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

sockaddr_in * PreGet(void *buffer,int bufferlen,bool noabort)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  int err;
  int c;
  socklen_t fromlen;
  bool noabort_local;
  void *pvStack_18;
  int bufferlen_local;
  void *buffer_local;
  
  err = 0x10;
  c._3_1_ = noabort;
  fromlen = bufferlen;
  pvStack_18 = buffer;
  sVar1 = recvfrom(mysocket,buffer,(long)bufferlen,0,(sockaddr *)&PreGet::fromaddress,
                   (socklen_t *)&err);
  if ((int)sVar1 == -1) {
    piVar2 = __errno_location();
    if ((*piVar2 == 0xb) || (((c._3_1_ & 1) != 0 && (*piVar2 == 0x68)))) {
      return (sockaddr_in *)0x0;
    }
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    I_Error("PreGet: %s",pcVar3);
  }
  return &PreGet::fromaddress;
}

Assistant:

sockaddr_in *PreGet (void *buffer, int bufferlen, bool noabort)
{
	static sockaddr_in fromaddress;
	socklen_t fromlen;
	int c;

	fromlen = sizeof(fromaddress);
	c = recvfrom (mysocket, (char *)buffer, bufferlen, 0,
		(sockaddr *)&fromaddress, &fromlen);

	if (c == SOCKET_ERROR)
	{
		int err = WSAGetLastError();
		if (err == WSAEWOULDBLOCK || (noabort && err == WSAECONNRESET))
			return NULL;	// no packet
		I_Error ("PreGet: %s", neterror ());
	}
	return &fromaddress;
}